

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O0

void crnlib::utils::endian_swap_mem16(uint16 *p,uint n)

{
  uint local_1c;
  uint16 *puStack_18;
  uint n_local;
  uint16 *p_local;
  
  local_1c = n;
  puStack_18 = p;
  while (local_1c != 0) {
    *puStack_18 = *puStack_18 << 8 | *puStack_18 >> 8;
    puStack_18 = puStack_18 + 1;
    local_1c = local_1c - 1;
  }
  return;
}

Assistant:

inline void endian_swap_mem16(uint16* p, uint n)
        {
            while (n--)
            {
                *p = swap16(*p);
                ++p;
            }
        }